

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<unsigned_long_long>::reserve(vector<unsigned_long_long> *this,uint new_capacity)

{
  uint uVar1;
  uint uVar2;
  unsigned_long_long *p;
  vector<unsigned_long_long> tmp;
  vector<unsigned_long_long> local_28;
  
  if (this->m_capacity < new_capacity) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,new_capacity,false,8,(object_mover)0x0,false);
    return;
  }
  if (new_capacity < this->m_capacity) {
    local_28.m_p = (unsigned_long_long *)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
    if (new_capacity < this->m_size) {
      new_capacity = this->m_size;
    }
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_28,new_capacity,false,8,(object_mover)0x0,false);
    if (&local_28 != this) {
      if (local_28.m_capacity < this->m_size) {
        if (local_28.m_p != (unsigned_long_long *)0x0) {
          crnlib_free(local_28.m_p);
          local_28.m_p = (unsigned_long_long *)0x0;
          local_28.m_size = 0;
          local_28.m_capacity = 0;
        }
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_28,this->m_size,false,8,(object_mover)0x0,false);
      }
      else if (local_28.m_size != 0) {
        local_28.m_size = 0;
      }
      memcpy(local_28.m_p,this->m_p,(ulong)this->m_size << 3);
      local_28.m_size = this->m_size;
    }
    p = this->m_p;
    this->m_p = local_28.m_p;
    uVar1 = this->m_size;
    this->m_size = local_28.m_size;
    uVar2 = this->m_capacity;
    this->m_capacity = local_28.m_capacity;
    local_28.m_capacity = uVar2;
    local_28.m_size = uVar1;
    if (p != (unsigned_long_long *)0x0) {
      local_28.m_p = p;
      crnlib_free(p);
    }
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity) {
    if (new_capacity > m_capacity)
      increase_capacity(new_capacity, false);
    else if (new_capacity < m_capacity) {
      // Must work around the lack of a "decrease_capacity()" method.
      // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
      vector tmp;
      tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
      tmp = *this;
      swap(tmp);
    }
  }